

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

GLuint __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::getProgramResourceIndex
          (FunctionalTest3_4 *this,GLuint program_id,GLenum program_interface,GLchar *resource_name)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  GLchar *local_1c8 [3];
  MessageBuilder local_1b0;
  GLuint local_2c;
  long lStack_28;
  GLuint index;
  Functions *gl;
  GLchar *resource_name_local;
  GLenum program_interface_local;
  GLuint program_id_local;
  FunctionalTest3_4 *this_local;
  
  gl = (Functions *)resource_name;
  resource_name_local._0_4_ = program_interface;
  resource_name_local._4_4_ = program_id;
  _program_interface_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar1);
  local_2c = (**(code **)(lStack_28 + 0x9a8))
                       (resource_name_local._4_4_,(GLenum)resource_name_local,gl);
  err = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(err,"getProgramResourceIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xc7a);
  if (local_2c == 0xffffffff) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1b0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1b0,(char (*) [43])"Error. Program resource is not available. ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [20])"Program interface: ");
    local_1c8[0] = Utils::programInterfaceToStr((GLenum)resource_name_local);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1c8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2b094bb);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [16])"Resource name: ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char **)&gl);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2b5e49a);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  }
  return local_2c;
}

Assistant:

GLuint FunctionalTest3_4::getProgramResourceIndex(GLuint program_id, GLenum program_interface,
												  const glw::GLchar* resource_name) const
{
	const glw::Functions& gl	= m_context.getRenderContext().getFunctions();
	GLuint				  index = gl.getProgramResourceIndex(program_id, program_interface, resource_name);

	GLU_EXPECT_NO_ERROR(gl.getError(), "getProgramResourceIndex");

	if (GL_INVALID_INDEX == index)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error. Program resource is not available. "
											<< "Program interface: " << Utils::programInterfaceToStr(program_interface)
											<< ". "
											<< "Resource name: " << resource_name << "." << tcu::TestLog::EndMessage;
	}

	return index;
}